

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeSystemPStateInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint Value;
  DecodeStatus DVar1;
  _Bool local_35;
  uint32_t pstate_field;
  uint32_t uStack_30;
  _Bool ValidNamed;
  uint32_t crm;
  uint32_t op2;
  uint32_t op1;
  void *Decoder_local;
  uint64_t Addr_local;
  MCInst *pMStack_10;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  _op2 = Decoder;
  Decoder_local = (void *)Addr;
  Addr_local._4_4_ = insn;
  pMStack_10 = Inst;
  crm = fieldFromInstruction(insn,0x10,3);
  uStack_30 = fieldFromInstruction(Addr_local._4_4_,5,3);
  pstate_field = fieldFromInstruction(Addr_local._4_4_,8,4);
  Value = crm << 3 | uStack_30;
  MCOperand_CreateImm0(pMStack_10,(ulong)Value);
  MCOperand_CreateImm0(pMStack_10,(ulong)pstate_field);
  A64NamedImmMapper_toString(&A64PState_PStateMapper,Value,&local_35);
  DVar1 = MCDisassembler_Fail;
  if ((local_35 & 1U) != 0) {
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeSystemPStateInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
	uint32_t op1 = fieldFromInstruction(insn, 16, 3);
	uint32_t op2 = fieldFromInstruction(insn, 5, 3);
	uint32_t crm = fieldFromInstruction(insn, 8, 4);
	bool ValidNamed;
	uint32_t pstate_field = (op1 << 3) | op2;

	MCOperand_CreateImm0(Inst, pstate_field);
	MCOperand_CreateImm0(Inst, crm);

	A64NamedImmMapper_toString(&A64PState_PStateMapper, pstate_field, &ValidNamed);

	return ValidNamed ? Success : Fail;
}